

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

bool __thiscall
kratos::PackedStructFieldDef::same(PackedStructFieldDef *this,PackedStructFieldDef *def)

{
  PackedStruct *def_00;
  size_t __n;
  bool bVar1;
  int iVar2;
  
  def_00 = def->struct_;
  if (this->struct_ == (PackedStruct *)0x0) {
    if ((((def_00 == (PackedStruct *)0x0) &&
         (__n = (this->name)._M_string_length, __n == (def->name)._M_string_length)) &&
        ((__n == 0 ||
         (iVar2 = bcmp((this->name)._M_dataplus._M_p,(def->name)._M_dataplus._M_p,__n), iVar2 == 0))
        )) && (this->width == def->width)) {
      return this->signed_ == def->signed_;
    }
  }
  else if (def_00 != (PackedStruct *)0x0) {
    bVar1 = PackedStruct::same(this->struct_,def_00);
    return bVar1;
  }
  return false;
}

Assistant:

bool PackedStructFieldDef::same(const PackedStructFieldDef &def) const {
    if (struct_ && def.struct_) {
        return struct_->same(*def.struct_);
    } else if (!struct_ && !def.struct_) {
        return name == def.name && width == def.width && signed_ == def.signed_;
    }
    return false;
}